

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_external_file_cache.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBExternalFileCacheInit(ClientContext *context,TableFunctionInitInput *input)

{
  ExternalFileCache *this;
  pointer pDVar1;
  templated_unique_single_t result;
  _Head_base<0UL,_duckdb::DuckDBExternalFileCacheData_*,_false> local_60;
  vector<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_> local_58;
  vector<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_> local_38;
  
  local_60._M_head_impl = (DuckDBExternalFileCacheData *)operator_new(0x28);
  *(undefined ***)
   &(((element_type *)local_60._M_head_impl)->super_enable_shared_from_this<duckdb::ClientContext>).
    __weak_this_.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2> =
       &PTR__DuckDBExternalFileCacheData_024948f8;
  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(((element_type *)local_60._M_head_impl)->
          super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_ + 8))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (((element_type *)local_60._M_head_impl)->db).internal.
  super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(((element_type *)local_60._M_head_impl)->db).internal + 8))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&((element_type *)local_60._M_head_impl)->interrupted = 0;
  this = ExternalFileCache::Get((ClientContext *)input);
  ExternalFileCache::GetCachedFileInformation
            ((vector<duckdb::CachedFileInformation,_true> *)&local_58,this);
  pDVar1 = unique_ptr<duckdb::DuckDBExternalFileCacheData,_std::default_delete<duckdb::DuckDBExternalFileCacheData>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBExternalFileCacheData,_std::default_delete<duckdb::DuckDBExternalFileCacheData>,_true>
                         *)&local_60);
  local_38.
  super__Vector_base<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pDVar1->entries).
       super_vector<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>.
       super__Vector_base<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pDVar1->entries).
       super_vector<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>.
       super__Vector_base<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pDVar1->entries).
       super_vector<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>.
       super__Vector_base<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pDVar1->entries).
  super_vector<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>.
  super__Vector_base<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_58.
       super__Vector_base<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pDVar1->entries).
  super_vector<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>.
  super__Vector_base<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_58.
       super__Vector_base<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pDVar1->entries).
  super_vector<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>.
  super__Vector_base<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.
       super__Vector_base<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.
  super__Vector_base<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>::
  ~vector(&local_38);
  ::std::vector<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>::
  ~vector(&local_58);
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_60._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBExternalFileCacheInit(ClientContext &context,
                                                                 TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBExternalFileCacheData>();
	result->entries = ExternalFileCache::Get(context).GetCachedFileInformation();
	return std::move(result);
}